

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MXF.cpp
# Opt level: O0

ostream * ASDCP::operator<<(ostream *strm,WriterInfo *Info)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_168;
  UUID local_d8;
  UUID local_b8;
  UUID local_98;
  UUID local_68;
  char local_48 [8];
  char str_buf [40];
  WriterInfo *Info_local;
  ostream *strm_local;
  
  poVar1 = std::operator<<(strm,"       ProductUUID: ");
  Kumu::UUID::UUID(&local_68,Info->ProductUUID);
  pcVar2 = Kumu::UUID::EncodeHex(&local_68,local_48,0x28);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Kumu::UUID::~UUID(&local_68);
  poVar1 = std::operator<<(strm,"    ProductVersion: ");
  poVar1 = std::operator<<(poVar1,(string *)&Info->ProductVersion);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"       CompanyName: ");
  poVar1 = std::operator<<(poVar1,(string *)&Info->CompanyName);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"       ProductName: ");
  poVar1 = std::operator<<(poVar1,(string *)&Info->ProductName);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"  EncryptedEssence: ");
  pcVar2 = "No";
  if ((Info->EncryptedEssence & 1U) != 0) {
    pcVar2 = "Yes";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((Info->EncryptedEssence & 1U) != 0) {
    poVar1 = std::operator<<(strm,"              HMAC: ");
    pcVar2 = "No";
    if ((Info->UsesHMAC & 1U) != 0) {
      pcVar2 = "Yes";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(strm,"         ContextID: ");
    Kumu::UUID::UUID(&local_98,Info->ContextID);
    pcVar2 = Kumu::UUID::EncodeHex(&local_98,local_48,0x28);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    Kumu::UUID::~UUID(&local_98);
    poVar1 = std::operator<<(strm,"CryptographicKeyID: ");
    Kumu::UUID::UUID(&local_b8,Info->CryptographicKeyID);
    pcVar2 = Kumu::UUID::EncodeHex(&local_b8,local_48,0x28);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    Kumu::UUID::~UUID(&local_b8);
  }
  poVar1 = std::operator<<(strm,"         AssetUUID: ");
  Kumu::UUID::UUID(&local_d8,Info->AssetUUID);
  pcVar2 = Kumu::UUID::EncodeHex(&local_d8,local_48,0x28);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Kumu::UUID::~UUID(&local_d8);
  poVar1 = std::operator<<(strm,"    Label Set Type: ");
  if (Info->LabelSetType == LS_MXF_SMPTE) {
    local_168 = "SMPTE";
  }
  else {
    local_168 = "Unknown";
    if (Info->LabelSetType == LS_MXF_INTEROP) {
      local_168 = "MXF Interop";
    }
  }
  poVar1 = std::operator<<(poVar1,local_168);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return strm;
}

Assistant:

std::ostream&
ASDCP::operator << (std::ostream& strm, const WriterInfo& Info)
{
  char str_buf[40];

  strm << "       ProductUUID: " << UUID(Info.ProductUUID).EncodeHex(str_buf, 40) << std::endl;
  strm << "    ProductVersion: " << Info.ProductVersion << std::endl;
  strm << "       CompanyName: " << Info.CompanyName << std::endl;
  strm << "       ProductName: " << Info.ProductName << std::endl;
  strm << "  EncryptedEssence: " << (Info.EncryptedEssence ? "Yes" : "No") << std::endl;

  if ( Info.EncryptedEssence )
    {
      strm << "              HMAC: " << (Info.UsesHMAC ? "Yes" : "No") << std::endl;
      strm << "         ContextID: " << UUID(Info.ContextID).EncodeHex(str_buf, 40) << std::endl;
      strm << "CryptographicKeyID: " << UUID(Info.CryptographicKeyID).EncodeHex(str_buf, 40) << std::endl;
    }

  strm << "         AssetUUID: " << UUID(Info.AssetUUID).EncodeHex(str_buf, 40) << std::endl;
  strm << "    Label Set Type: " << (Info.LabelSetType == LS_MXF_SMPTE ? "SMPTE" :
				     (Info.LabelSetType == LS_MXF_INTEROP ? "MXF Interop" :
				      "Unknown")) << std::endl;
  return strm;
}